

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# defopcode.c
# Opt level: O0

int synthetic_opcode_size(OpcodeMappingInfo *map)

{
  int local_18;
  int local_14;
  int size;
  int i;
  OpcodeMappingInfo *map_local;
  
  local_18 = 4;
  local_14 = 0;
  while ((local_14 < 4 &&
         ((((ushort)map->bitfield[local_14] >> 1 & 0x7f) != 0x7e ||
          (((ushort)map->bitfield[local_14] >> 8 & 0x1f) != 0x1e))))) {
    local_18 = ((ushort)map->bitfield[local_14] >> 0xf) + 1 + local_18;
    local_14 = local_14 + 1;
  }
  return local_18;
}

Assistant:

int
synthetic_opcode_size (const OpcodeMappingInfo *map)
{
  int i, size = PTR_WORDS;  /* Account for the synthetic opcode. */

  for (i = 0; i < MAX_BITFIELDS; i++)
    {
      if (IS_TERMINATING_BITFIELD (&map->bitfield[i]))
	break;
      size += map->bitfield[i].words + 1;
    }

  return size;
}